

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O0

string * __thiscall
cmDebugServerJson::StatusString_abi_cxx11_(string *__return_storage_ptr__,cmDebugServerJson *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  SnapshotType SVar4;
  LongLong value_00;
  Value *pVVar5;
  cmListFileContext *pcVar6;
  allocator local_409;
  Value local_408;
  cmListFileBacktrace local_3e0;
  Value local_3c0;
  Value local_398;
  Value local_370;
  Value local_348;
  Value local_320;
  Value local_2f8;
  Value local_2d0;
  Value local_2a8;
  cmStateSnapshot local_280;
  Value local_268;
  Value local_240;
  Value local_218;
  Value local_1f0;
  undefined1 local_1c8 [8];
  Value frame;
  Int line;
  int id;
  cmListFileBacktrace backtrace;
  cmListFileContext currentLine;
  cmPauseContext ctx;
  Value back;
  Value local_c8;
  Value local_a0;
  undefined1 local_78 [8];
  Value value;
  allocator local_39;
  string local_38 [8];
  string state;
  cmDebugServerJson *this_local;
  
  state.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  Json::Value::Value((Value *)local_78,nullValue);
  value_00 = cmsys::SystemInformation::GetProcessId(&::info);
  Json::Value::Value(&local_a0,value_00);
  pVVar5 = Json::Value::operator[]((Value *)local_78,"PID");
  Json::Value::operator=(pVVar5,&local_a0);
  Json::Value::~Value(&local_a0);
  iVar3 = (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[9])();
  if (iVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_409);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
  }
  else {
    if (iVar3 == 1) {
      Json::Value::Value(&local_c8,"Running");
      pVVar5 = Json::Value::operator[]((Value *)local_78,"State");
      Json::Value::operator=(pVVar5,&local_c8);
      Json::Value::~Value(&local_c8);
    }
    else if (iVar3 == 2) {
      Json::Value::Value((Value *)&back.limit_,"Paused");
      pVVar5 = Json::Value::operator[]((Value *)local_78,"State");
      Json::Value::operator=(pVVar5,(Value *)&back.limit_);
      Json::Value::~Value((Value *)&back.limit_);
      Json::Value::Value((Value *)&ctx.Lock._M_owns,arrayValue);
      (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x17])
                (&currentLine.Line);
      bVar1 = cmPauseContext::operator_cast_to_bool((cmPauseContext *)&currentLine.Line);
      if (bVar1) {
        cmPauseContext::CurrentLine
                  ((cmListFileContext *)&backtrace.Cur,(cmPauseContext *)&currentLine.Line);
        cmPauseContext::GetBacktrace
                  ((cmListFileBacktrace *)&line,(cmPauseContext *)&currentLine.Line);
        frame.limit_._4_4_ = 0;
        while( true ) {
          cmListFileBacktrace::Top((cmListFileBacktrace *)&line);
          bVar2 = std::__cxx11::string::empty();
          if (((bVar2 ^ 0xff) & 1) == 0) break;
          pcVar6 = cmListFileBacktrace::Top((cmListFileBacktrace *)&line);
          frame.limit_._0_4_ = (int)pcVar6->Line;
          if ((int)frame.limit_ != 0) {
            Json::Value::Value((Value *)local_1c8,objectValue);
            iVar3 = frame.limit_._4_4_;
            frame.limit_._4_4_ = frame.limit_._4_4_ + 1;
            Json::Value::Value(&local_1f0,iVar3);
            pVVar5 = Json::Value::operator[]((Value *)local_1c8,"ID");
            Json::Value::operator=(pVVar5,&local_1f0);
            Json::Value::~Value(&local_1f0);
            pcVar6 = cmListFileBacktrace::Top((cmListFileBacktrace *)&line);
            Json::Value::Value(&local_218,&pcVar6->FilePath);
            pVVar5 = Json::Value::operator[]((Value *)local_1c8,"File");
            Json::Value::operator=(pVVar5,&local_218);
            Json::Value::~Value(&local_218);
            Json::Value::Value(&local_240,(int)frame.limit_);
            pVVar5 = Json::Value::operator[]((Value *)local_1c8,"Line");
            Json::Value::operator=(pVVar5,&local_240);
            Json::Value::~Value(&local_240);
            pcVar6 = cmListFileBacktrace::Top((cmListFileBacktrace *)&line);
            Json::Value::Value(&local_268,&pcVar6->Name);
            pVVar5 = Json::Value::operator[]((Value *)local_1c8,"Name");
            Json::Value::operator=(pVVar5,&local_268);
            Json::Value::~Value(&local_268);
            cmListFileBacktrace::GetBottom(&local_280,(cmListFileBacktrace *)&line);
            SVar4 = cmStateSnapshot::GetType(&local_280);
            switch(SVar4) {
            case BaseType:
              Json::Value::Value(&local_2a8,"BaseType");
              pVVar5 = Json::Value::operator[]((Value *)local_1c8,"Type");
              Json::Value::operator=(pVVar5,&local_2a8);
              Json::Value::~Value(&local_2a8);
              break;
            case BuildsystemDirectoryType:
              Json::Value::Value(&local_2d0,"BuildsystemDirectoryType");
              pVVar5 = Json::Value::operator[]((Value *)local_1c8,"Type");
              Json::Value::operator=(pVVar5,&local_2d0);
              Json::Value::~Value(&local_2d0);
              break;
            case FunctionCallType:
              Json::Value::Value(&local_2f8,"FunctionCallType");
              pVVar5 = Json::Value::operator[]((Value *)local_1c8,"Type");
              Json::Value::operator=(pVVar5,&local_2f8);
              Json::Value::~Value(&local_2f8);
              break;
            case MacroCallType:
              Json::Value::Value(&local_320,"MacroCallType");
              pVVar5 = Json::Value::operator[]((Value *)local_1c8,"Type");
              Json::Value::operator=(pVVar5,&local_320);
              Json::Value::~Value(&local_320);
              break;
            case IncludeFileType:
              Json::Value::Value(&local_348,"IncludeFileType");
              pVVar5 = Json::Value::operator[]((Value *)local_1c8,"Type");
              Json::Value::operator=(pVVar5,&local_348);
              Json::Value::~Value(&local_348);
              break;
            case InlineListFileType:
              Json::Value::Value(&local_370,"InlineListFileType");
              pVVar5 = Json::Value::operator[]((Value *)local_1c8,"Type");
              Json::Value::operator=(pVVar5,&local_370);
              Json::Value::~Value(&local_370);
              break;
            case PolicyScopeType:
              Json::Value::Value(&local_398,"PolicyScopeType");
              pVVar5 = Json::Value::operator[]((Value *)local_1c8,"Type");
              Json::Value::operator=(pVVar5,&local_398);
              Json::Value::~Value(&local_398);
              break;
            case VariableScopeType:
              Json::Value::Value(&local_3c0,"VariableScopeType");
              pVVar5 = Json::Value::operator[]((Value *)local_1c8,"Type");
              Json::Value::operator=(pVVar5,&local_3c0);
              Json::Value::~Value(&local_3c0);
            }
            Json::Value::append((Value *)&ctx.Lock._M_owns,(Value *)local_1c8);
            Json::Value::~Value((Value *)local_1c8);
          }
          cmListFileBacktrace::Pop(&local_3e0,(cmListFileBacktrace *)&line);
          cmListFileBacktrace::operator=((cmListFileBacktrace *)&line,&local_3e0);
          cmListFileBacktrace::~cmListFileBacktrace(&local_3e0);
        }
        Json::Value::Value(&local_408,(Value *)&ctx.Lock._M_owns);
        pVVar5 = Json::Value::operator[]((Value *)local_78,"Backtrace");
        Json::Value::operator=(pVVar5,&local_408);
        Json::Value::~Value(&local_408);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&line);
        cmListFileContext::~cmListFileContext((cmListFileContext *)&backtrace.Cur);
      }
      cmPauseContext::~cmPauseContext((cmPauseContext *)&currentLine.Line);
      Json::Value::~Value((Value *)&ctx.Lock._M_owns);
    }
    Json::Value::toStyledString_abi_cxx11_(__return_storage_ptr__,(Value *)local_78);
  }
  Json::Value::~Value((Value *)local_78);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmDebugServerJson::StatusString() const
{
  std::string state = "";
  Json::Value value;
  value["PID"] = info.GetProcessId();

  switch (Debugger.CurrentState()) {
    case cmDebugger::State::Running:
      value["State"] = "Running";
      break;
    case cmDebugger::State::Paused: {
      value["State"] = "Paused";
      Json::Value back(Json::arrayValue);

      if (auto ctx = Debugger.PauseContext()) {
        auto currentLine = ctx.CurrentLine();
        auto backtrace = ctx.GetBacktrace();
        int id = 0;
        while (!backtrace.Top().FilePath.empty()) {
          auto line = Json::Value::Int(backtrace.Top().Line);
          if (line != 0) {
            Json::Value frame(Json::objectValue);
            frame["ID"] = id++;
            frame["File"] = backtrace.Top().FilePath;
            frame["Line"] = line;
            frame["Name"] = backtrace.Top().Name;

            switch (backtrace.GetBottom().GetType()) {
              case cmStateEnums::BaseType:
                frame["Type"] = "BaseType";
                break;
              case cmStateEnums::BuildsystemDirectoryType:
                frame["Type"] = "BuildsystemDirectoryType";
                break;
              case cmStateEnums::FunctionCallType:
                frame["Type"] = "FunctionCallType";
                break;
              case cmStateEnums::MacroCallType:
                frame["Type"] = "MacroCallType";
                break;
              case cmStateEnums::IncludeFileType:
                frame["Type"] = "IncludeFileType";
                break;
              case cmStateEnums::InlineListFileType:
                frame["Type"] = "InlineListFileType";
                break;
              case cmStateEnums::PolicyScopeType:
                frame["Type"] = "PolicyScopeType";
                break;
              case cmStateEnums::VariableScopeType:
                frame["Type"] = "VariableScopeType";
                break;
            }

            back.append(frame);
          }
          backtrace = backtrace.Pop();
        }
        value["Backtrace"] = back;
      }

    } break;
    case cmDebugger::State::Unknown:
      return "";
  }

  return value.toStyledString();
}